

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O2

void __thiscall xray_re::xr_sector_object::save_v12(xr_sector_object *this,xr_ini_writer *w)

{
  size_t in_RCX;
  size_t __n;
  void *__buf;
  char *__buf_00;
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1d23d9,(void *)0xff,in_RCX);
  xr_ini_writer::write(w,0x1d23eb,__buf,in_RCX);
  __buf_00 = "on";
  if (this->m_private == '\0') {
    __buf_00 = "off";
  }
  __n = 1;
  xr_ini_writer::write(w,0x1c8f35,__buf_00,1);
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,write_ini_item>
            (w,&this->m_items);
  xr_ini_writer::write
            (w,0x1d23f8,
             (void *)((long)(this->m_items).
                            super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_items).
                            super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6),__n);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sector_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("change_map_to_idx", 255);
	w->write("sector_color", this->m_color);
	w->write("default", this->m_private ? "on" : "off");

	w->w_ini_seq(this->m_items, write_ini_item());
	w->write("items_count", this->m_items.size());
	w->write("version", SECTOR_VERSION_V12);
}